

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

void __thiscall QMakeEvaluator::setupProject(QMakeEvaluator *this)

{
  int iVar1;
  QList<ProString> *pQVar2;
  _List_node_base *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_d0;
  QFileInfo local_b8 [8];
  QArrayDataPointer<char16_t> local_b0;
  ProString local_98;
  ProKey local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  setTemplate(this);
  this_00 = (this->m_valuemapStack).
            super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
            super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
            ._M_impl._M_node.super__List_node_base._M_prev + 1;
  iVar1 = currentFileId(this);
  ProKey::ProKey(&local_68,"TARGET");
  pQVar2 = &QMap<ProKey,_ProStringList>::operator[]
                      ((QMap<ProKey,_ProStringList> *)this_00,&local_68)->super_QList<ProString>;
  currentFileName((QString *)&local_d0,this);
  QFileInfo::QFileInfo(local_b8,(QString *)&local_d0);
  QFileInfo::baseName();
  ProString::ProString(&local_98,(QString *)&local_b0);
  local_98.m_file = iVar1;
  QList<ProString>::emplaceBack<ProString_const&>(pQVar2,&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  QFileInfo::~QFileInfo(local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  ProKey::ProKey(&local_68,"_PRO_FILE_");
  pQVar2 = &QMap<ProKey,_ProStringList>::operator[]
                      ((QMap<ProKey,_ProStringList> *)this_00,&local_68)->super_QList<ProString>;
  currentFileName((QString *)&local_b0,this);
  ProString::ProString(&local_98,(QString *)&local_b0);
  local_98.m_file = iVar1;
  QList<ProString>::emplaceBack<ProString_const&>(pQVar2,&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  ProKey::ProKey(&local_68,"_PRO_FILE_PWD_");
  pQVar2 = &QMap<ProKey,_ProStringList>::operator[]
                      ((QMap<ProKey,_ProStringList> *)this_00,&local_68)->super_QList<ProString>;
  currentDirectory((QString *)&local_b0,this);
  ProString::ProString(&local_98,(QString *)&local_b0);
  local_98.m_file = iVar1;
  QList<ProString>::emplaceBack<ProString_const&>(pQVar2,&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  ProKey::ProKey(&local_68,"OUT_PWD");
  pQVar2 = &QMap<ProKey,_ProStringList>::operator[]
                      ((QMap<ProKey,_ProStringList> *)this_00,&local_68)->super_QList<ProString>;
  ProString::ProString(&local_98,&this->m_outputDir);
  local_98.m_file = iVar1;
  QList<ProString>::emplaceBack<ProString_const&>(pQVar2,&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::setupProject()
{
    setTemplate();
    ProValueMap &vars = m_valuemapStack.top();
    int proFile = currentFileId();
    vars[ProKey("TARGET")] << ProString(QFileInfo(currentFileName()).baseName()).setSource(proFile);
    vars[ProKey("_PRO_FILE_")] << ProString(currentFileName()).setSource(proFile);
    vars[ProKey("_PRO_FILE_PWD_")] << ProString(currentDirectory()).setSource(proFile);
    vars[ProKey("OUT_PWD")] << ProString(m_outputDir).setSource(proFile);
}